

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbFileControl(sqlite3_file *pFile,int op,void *pArg)

{
  sqlite3_io_methods *p_00;
  char *pcVar1;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *local_38;
  sqlite3_int64 iLimit;
  int rc;
  MemStore *p;
  void *pArg_local;
  int op_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  iLimit._4_4_ = 0xc;
  memdbEnter((MemStore *)p_00);
  if (op == 0xc) {
    pcVar1 = sqlite3_mprintf("memdb(%p,%lld)",p_00->xWrite,*(undefined8 *)p_00);
    *(char **)pArg = pcVar1;
    iLimit._4_4_ = 0;
  }
  if (op == 0x24) {
    local_38 = *pArg;
    if ((long)local_38 < *(long *)p_00) {
      if ((long)local_38 < 0) {
        local_38 = p_00->xRead;
      }
      else {
        local_38 = *(_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **)p_00;
      }
    }
    p_00->xRead = local_38;
    *(_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **)pArg = local_38;
    iLimit._4_4_ = 0;
  }
  memdbLeave((MemStore *)p_00);
  return iLimit._4_4_;
}

Assistant:

static int memdbFileControl(sqlite3_file *pFile, int op, void *pArg){
  MemStore *p = ((MemFile*)pFile)->pStore;
  int rc = SQLITE_NOTFOUND;
  memdbEnter(p);
  if( op==SQLITE_FCNTL_VFSNAME ){
    *(char**)pArg = sqlite3_mprintf("memdb(%p,%lld)", p->aData, p->sz);
    rc = SQLITE_OK;
  }
  if( op==SQLITE_FCNTL_SIZE_LIMIT ){
    sqlite3_int64 iLimit = *(sqlite3_int64*)pArg;
    if( iLimit<p->sz ){
      if( iLimit<0 ){
        iLimit = p->szMax;
      }else{
        iLimit = p->sz;
      }
    }
    p->szMax = iLimit;
    *(sqlite3_int64*)pArg = iLimit;
    rc = SQLITE_OK;
  }
  memdbLeave(p);
  return rc;
}